

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O3

void Am_Show_Alert_Dialog(Am_Value_List *alert_texts,int x,int y,bool modal)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Object *this;
  Am_Object the_dialog;
  Am_Value dummy;
  Am_Object local_50;
  Am_Value_List local_48;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  
  local_50.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Value_List::Empty(&cached_alert_dialogs);
  if (bVar1) {
    Am_Object::Create((Am_Object *)&local_48,(char *)&Am_Alert_Dialog);
    Am_Object::operator=(&local_50,(Am_Object *)&local_48);
    Am_Object::~Am_Object((Am_Object *)&local_48);
  }
  else {
    Am_Value_List::Pop(&local_48,true);
    Am_Object::operator=(&local_50,(Am_Value *)&local_48);
    Am_Value::~Am_Value((Am_Value *)&local_48);
  }
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(alert_texts);
  Am_Object::Set(&local_50,0xa2,pAVar2,0);
  Am_Object::Get_Object((Am_Object *)&local_48,(Am_Slot_Key)&local_50,0xc5);
  this = Am_Object::Set((Am_Object *)&local_48,0xca,do_stop_waiting_for_dialog.from_wrapper,0);
  Am_Object::Set(this,0xc9,do_abort_waiting_for_dialog.from_wrapper,0);
  Am_Object::~Am_Object((Am_Object *)&local_48);
  Am_Object::Am_Object(&local_28,&local_50);
  Am_Object::Add_Part(&Am_Screen,&local_28,true,0);
  Am_Object::~Am_Object(&local_28);
  set_dialog_position(&local_50,x,y);
  local_48.data._0_2_ = 0;
  local_48.item = (Am_List_Item *)0x0;
  Am_Object::Am_Object(&local_30,&local_50);
  Am_Pop_Up_Window_And_Wait(&local_30,(Am_Value *)&local_48,modal);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Am_Object(&local_38,&local_50);
  Am_Object::Remove_Part(&Am_Screen,&local_38);
  Am_Object::~Am_Object(&local_38);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_50);
  Am_Value_List::Add(&cached_alert_dialogs,pAVar2,Am_HEAD,true);
  Am_Value::~Am_Value((Am_Value *)&local_48);
  Am_Object::~Am_Object(&local_50);
  return;
}

Assistant:

void
Am_Show_Alert_Dialog(Am_Value_List alert_texts,
                     int x /* = Am_AT_CENTER_SCREEN*/,
                     int y /*= Am_AT_CENTER_SCREEN*/, bool modal /*= false*/)
{
  Am_Object the_dialog;
  if (cached_alert_dialogs.Empty())
    the_dialog = Am_Alert_Dialog.Create();
  else {
    the_dialog = cached_alert_dialogs.Pop();
  }
  the_dialog.Set(Am_ITEMS, alert_texts);
  the_dialog.Get_Object(Am_COMMAND)
      .Set(Am_DO_METHOD, do_stop_waiting_for_dialog)
      .Set(Am_ABORT_DO_METHOD, do_abort_waiting_for_dialog);
  Am_Screen.Add_Part(the_dialog);
  set_dialog_position(the_dialog, x, y);
  Am_Value dummy;
  Am_Pop_Up_Window_And_Wait(the_dialog, dummy, modal);
  Am_Screen.Remove_Part(the_dialog);
  cached_alert_dialogs.Push(the_dialog);
}